

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_componentElementIssues_Test::~Parser_componentElementIssues_Test
          (Parser_componentElementIssues_Test *this)

{
  Parser_componentElementIssues_Test *this_local;
  
  ~Parser_componentElementIssues_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, componentElementIssues)
{
    const std::string in1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"\">\n"
        "    <son name=\"stan\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::string expectError1 = "Component '' has an invalid child element 'son'.";
    const std::string in2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"randy\">\n"
        "    <son name=\"stan\"/>\n"
        "  </component>\n"
        "</model>\n";
    const std::string expectError2 = "Component 'randy' has an invalid child element 'son'.";

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in1);
    EXPECT_EQ(size_t(1), p->issueCount());
    EXPECT_EQ(expectError1, p->issue(0)->description());

    p->parseModel(in2);
    EXPECT_EQ(size_t(1), p->issueCount());
    EXPECT_EQ(expectError2, p->issue(0)->description());
}